

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InlinePass::CloneAndMapLocals
          (InlinePass *this,Function *calleeFn,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *new_vars,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,DebugInlinedAtContext *inlined_at_ctx)

{
  Op OVar1;
  CommonDebugInfoInstructions CVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  IRContext *pIVar5;
  DecorationManager *this_00;
  pointer pIVar6;
  DebugInfoManager *this_01;
  mapped_type *pmVar7;
  bool bVar8;
  uint32_t local_64;
  uint local_60;
  uint32_t local_5c;
  uint32_t newId;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> var_inst;
  iterator callee_var_itr;
  iterator callee_block_itr;
  DebugInlinedAtContext *inlined_at_ctx_local;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *callee2caller_local;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *new_vars_local;
  Function *calleeFn_local;
  InlinePass *this_local;
  
  _callee_var_itr = opt::Function::begin(calleeFn);
  UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&callee_var_itr);
  BasicBlock::begin((BasicBlock *)&var_inst);
  do {
    while( true ) {
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)&var_inst);
      OVar1 = opt::Instruction::opcode(pIVar4);
      bVar8 = true;
      if (OVar1 != OpVariable) {
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)&var_inst);
        CVar2 = opt::Instruction::GetCommonDebugOpcode(pIVar4);
        bVar8 = CVar2 == CommonDebugInfoDebugDeclare;
      }
      if (!bVar8) {
        this_local._7_1_ = 1;
        goto LAB_009ef14c;
      }
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)&var_inst);
      OVar1 = opt::Instruction::opcode(pIVar4);
      if (OVar1 == OpVariable) break;
      InstructionList::iterator::operator++((iterator *)&var_inst);
    }
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)&var_inst);
    pIVar5 = Pass::context(&this->super_Pass);
    pIVar4 = opt::Instruction::Clone(pIVar4,pIVar5);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&stack0xffffffffffffffa8,pIVar4);
    pIVar5 = Pass::context(&this->super_Pass);
    local_5c = IRContext::TakeNextId(pIVar5);
    bVar8 = local_5c != 0;
    if (bVar8) {
      this_00 = Pass::get_decoration_mgr(&this->super_Pass);
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)&var_inst);
      uVar3 = opt::Instruction::result_id(pIVar4);
      analysis::DecorationManager::CloneDecorations(this_00,uVar3,local_5c);
      pIVar6 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                             *)&stack0xffffffffffffffa8);
      opt::Instruction::SetResultId(pIVar6,local_5c);
      pIVar6 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                             *)&stack0xffffffffffffffa8);
      pIVar5 = Pass::context(&this->super_Pass);
      this_01 = IRContext::get_debug_info_mgr(pIVar5);
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)&var_inst);
      uVar3 = opt::Instruction::GetDebugInlinedAt(pIVar4);
      uVar3 = analysis::DebugInfoManager::BuildDebugInlinedAtChain(this_01,uVar3,inlined_at_ctx);
      opt::Instruction::UpdateDebugInlinedAt(pIVar6,uVar3);
      uVar3 = local_5c;
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)&var_inst);
      local_64 = opt::Instruction::result_id(pIVar4);
      pmVar7 = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](callee2caller,&local_64);
      *pmVar7 = uVar3;
      std::
      vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ::push_back(new_vars,(value_type *)&stack0xffffffffffffffa8);
      InstructionList::iterator::operator++((iterator *)&var_inst);
    }
    else {
      this_local._7_1_ = 0;
    }
    local_60 = (uint)!bVar8;
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)&stack0xffffffffffffffa8);
  } while (local_60 == 0);
LAB_009ef14c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool InlinePass::CloneAndMapLocals(
    Function* calleeFn, std::vector<std::unique_ptr<Instruction>>* new_vars,
    std::unordered_map<uint32_t, uint32_t>* callee2caller,
    analysis::DebugInlinedAtContext* inlined_at_ctx) {
  auto callee_block_itr = calleeFn->begin();
  auto callee_var_itr = callee_block_itr->begin();
  while (callee_var_itr->opcode() == spv::Op::OpVariable ||
         callee_var_itr->GetCommonDebugOpcode() ==
             CommonDebugInfoDebugDeclare) {
    if (callee_var_itr->opcode() != spv::Op::OpVariable) {
      ++callee_var_itr;
      continue;
    }

    std::unique_ptr<Instruction> var_inst(callee_var_itr->Clone(context()));
    uint32_t newId = context()->TakeNextId();
    if (newId == 0) {
      return false;
    }
    get_decoration_mgr()->CloneDecorations(callee_var_itr->result_id(), newId);
    var_inst->SetResultId(newId);
    var_inst->UpdateDebugInlinedAt(
        context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
            callee_var_itr->GetDebugInlinedAt(), inlined_at_ctx));
    (*callee2caller)[callee_var_itr->result_id()] = newId;
    new_vars->push_back(std::move(var_inst));
    ++callee_var_itr;
  }
  return true;
}